

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int get_path_component(char *name,int n,char *fn)

{
  char *pcVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  char *__s;
  int iVar3;
  
  __s = (char *)CONCAT44(in_register_00000034,n);
  pcVar1 = strchr(__s,0x2f);
  if (pcVar1 == (char *)0x0) {
    sVar2 = strlen(__s);
    iVar3 = (int)sVar2;
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    iVar3 = (int)pcVar1 - n;
  }
  if (iVar3 < 0x100) {
    memcpy(name,__s,(long)iVar3);
    name[iVar3] = '\0';
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}